

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isMatchingDelims(TokenKind openKind,TokenKind closeKind)

{
  TokenKind TVar1;
  TokenKind in_SI;
  TokenKind in_DI;
  bool local_1;
  
  TVar1 = getSkipToKind(in_DI);
  if (TVar1 == in_SI) {
    local_1 = true;
  }
  else if ((in_DI == ForkKeyword) && ((ushort)(in_SI - JoinKeyword) < 3)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isMatchingDelims(TokenKind openKind, TokenKind closeKind) {
    if (getSkipToKind(openKind) == closeKind)
        return true;

    if (openKind == TokenKind::ForkKeyword) {
        switch (closeKind) {
            case TokenKind::JoinKeyword:
            case TokenKind::JoinAnyKeyword:
            case TokenKind::JoinNoneKeyword:
                return true;
            default:
                break;
        }
    }

    return false;
}